

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

Pattern * __thiscall OrPattern::doOr(OrPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  OrPattern *this_00;
  undefined8 *puVar3;
  pointer ppDVar4;
  int4 i;
  ulong uVar5;
  pointer ppDVar6;
  DisjointPattern *local_60;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> newlist;
  
  if (b == (Pattern *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
  }
  newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppDVar6 = (this->orlist).
                 super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppDVar6 !=
      (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppDVar6 = ppDVar6 + 1) {
    iVar1 = (*((*ppDVar6)->super_Pattern)._vptr_Pattern[2])();
    local_60 = (DisjointPattern *)CONCAT44(extraout_var,iVar1);
    std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::emplace_back<DisjointPattern*>
              ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&newlist,&local_60);
  }
  if (sa < 0) {
    for (ppDVar4 = (this->orlist).
                   super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppDVar4 != ppDVar6; ppDVar4 = ppDVar4 + 1) {
      (*((*ppDVar4)->super_Pattern)._vptr_Pattern[3])(*ppDVar4,(ulong)(uint)-sa);
      ppDVar6 = (this->orlist).
                super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  if (lVar2 == 0) {
    iVar1 = (*b->_vptr_Pattern[2])();
    local_60 = (DisjointPattern *)CONCAT44(extraout_var_00,iVar1);
    std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::emplace_back<DisjointPattern*>
              ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&newlist,&local_60);
  }
  else {
    for (puVar3 = *(undefined8 **)(lVar2 + 8); puVar3 != *(undefined8 **)(lVar2 + 0x10);
        puVar3 = puVar3 + 1) {
      local_60 = (DisjointPattern *)(**(code **)(*(long *)*puVar3 + 0x10))();
      std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::emplace_back<DisjointPattern*>
                ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&newlist,&local_60);
    }
  }
  if (0 < sa) {
    uVar5 = 0;
    while( true ) {
      if ((ulong)((long)newlist.
                        super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)newlist.
                        super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) break;
      (*(newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5]->super_Pattern)._vptr_Pattern[3])
                (newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar5],(ulong)(uint)sa);
      uVar5 = uVar5 + 1;
    }
  }
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern(this_00,&newlist);
  std::_Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::~_Vector_base
            (&newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>);
  return &this_00->super_Pattern;
}

Assistant:

Pattern *OrPattern::doOr(const Pattern *b,int4 sa) const

{
  const OrPattern *b2 = dynamic_cast<const OrPattern *>(b);
  vector<DisjointPattern *> newlist;
  vector<DisjointPattern *>::const_iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    newlist.push_back((DisjointPattern *)(*iter)->simplifyClone());
  if (sa < 0)
    for(iter=orlist.begin();iter!=orlist.end();++iter)
      (*iter)->shiftInstruction(-sa);

  if (b2 == (const OrPattern *)0)
    newlist.push_back((DisjointPattern *)b->simplifyClone());
  else {
    for(iter=b2->orlist.begin();iter!=b2->orlist.end();++iter)
      newlist.push_back((DisjointPattern *)(*iter)->simplifyClone());
  }
  if (sa > 0)
    for(int4 i=0;i<newlist.size();++i)
      newlist[i]->shiftInstruction(sa);

  OrPattern *tmpor = new OrPattern(newlist);
  return tmpor;
}